

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Float __thiscall pbrt::HaltonSampler::SampleDimension(HaltonSampler *this,int dimension)

{
  DigitPermutation *pDVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  
  switch(this->randomizeStrategy) {
  case None:
    if (this->haltonIndex == 0) {
      auVar10 = ZEXT816(0) << 0x40;
    }
    else {
      uVar3 = (ulong)(int)(&Primes)[dimension];
      fVar8 = 1.0;
      lVar5 = 0;
      uVar4 = this->haltonIndex;
      do {
        lVar5 = (lVar5 - uVar4 / uVar3) * uVar3 + uVar4;
        fVar8 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar8;
        bVar7 = uVar3 <= uVar4;
        uVar4 = uVar4 / uVar3;
      } while (bVar7);
      auVar10 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,lVar5);
      auVar10 = ZEXT416((uint)(fVar8 * auVar10._0_4_));
    }
    break;
  case CranleyPatterson:
    uVar4 = (long)dimension << 0x20;
    uVar4 = (uVar4 >> 0x1f ^ uVar4 + 1) * 0x7fb5d329728ea185;
    lVar5 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
    auVar10 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,(uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5);
    if (this->haltonIndex == 0) {
      auVar11 = ZEXT816(0) << 0x40;
    }
    else {
      uVar3 = (ulong)(int)(&Primes)[dimension];
      fVar8 = 1.0;
      lVar5 = 0;
      uVar4 = this->haltonIndex;
      do {
        lVar5 = (lVar5 - uVar4 / uVar3) * uVar3 + uVar4;
        fVar8 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar8;
        bVar7 = uVar3 <= uVar4;
        uVar4 = uVar4 / uVar3;
      } while (bVar7);
      auVar11 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,lVar5);
      auVar11 = ZEXT416((uint)(fVar8 * auVar11._0_4_));
    }
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar11);
    fVar8 = auVar10._0_4_ * 2.3283064e-10 + auVar11._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT416(0x3f800000),9);
    bVar7 = (bool)((byte)uVar2 & 1);
    return (Float)((uint)bVar7 * (int)fVar8 + (uint)!bVar7 * (int)(fVar8 + -1.0));
  case PermuteDigits:
    pDVar1 = this->digitPermutations->ptr;
    uVar3 = (ulong)(int)(&Primes)[dimension];
    fVar8 = 1.0;
    iVar6 = 0;
    lVar5 = 0;
    uVar4 = this->haltonIndex;
    do {
      lVar5 = (ulong)pDVar1[dimension].permutations
                     [iVar6 * pDVar1[dimension].base + (int)(uVar4 % uVar3)] + lVar5 * uVar3;
      fVar8 = (1.0 / (float)(int)(&Primes)[dimension]) * fVar8;
      iVar6 = iVar6 + 1;
      uVar4 = uVar4 / uVar3;
    } while (1.0 - fVar8 < 1.0);
    auVar10 = vcvtusi2ss_avx512f(in_XMM4,lVar5);
    auVar10 = ZEXT416((uint)(fVar8 * auVar10._0_4_));
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.h"
             ,0x88,"Unhandled randomization strategy");
  case Owen:
    uVar4 = (((ulong)(uint)dimension << 0x20) >> 0x1f ^ ((ulong)(uint)dimension << 0x20) + 1) *
            0x7fb5d329728ea185;
    lVar5 = (uVar4 >> 0x1b ^ uVar4) * -0x7e25210b43d22bb3;
    FVar9 = OwenScrambledRadicalInverse
                      (dimension,this->haltonIndex,(uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5);
    return FVar9;
  }
  auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar10);
  return auVar10._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return RadicalInverse(dimension, haltonIndex);
        case RandomizeStrategy::CranleyPatterson: {
            Float u = uint32_t(MixBits(1 + (uint64_t(dimension) << 32))) * 0x1p-32f;
            Float s = RadicalInverse(dimension, haltonIndex) + u;
            if (s >= 1)
                s -= 1;
            return s;
        }
        case RandomizeStrategy::PermuteDigits:
            return ScrambledRadicalInverse(dimension, haltonIndex,
                                           (*digitPermutations)[dimension]);
        case RandomizeStrategy::Owen:
            return OwenScrambledRadicalInverse(dimension, haltonIndex,
                                               MixBits(1 + (uint64_t(dimension) << 32)));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }